

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O1

uint64_t helper_iwmmxt_srlw_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = (byte)n;
  uVar5 = (x & 0xffff) >> (bVar2 & 0x3f);
  uVar1 = ((uint)x & 0xffff0000) >> (bVar2 & 0x3f);
  uVar3 = (x & 0xffff00000000) >> (bVar2 & 0x3f);
  uVar4 = (x & 0xffff000000000000) >> (bVar2 & 0x3f);
  (env->iwmmxt).cregs[3] =
       (uint)(uVar4 >> 0x30 == 0) << 0x1e | (uint)(uVar4 >> 0x20) & 0x80000000 |
       CONCAT31((int3)((0U >> (bVar2 & 0x3f)) >> 8),uVar3 >> 0x20 == 0) << 0x16 |
       (uint)(uVar3 >> 0x2f) << 0x17 |
       (uint)(uVar1 < 0x10000) << 0xe |
       (uint)(0x7fffffff < uVar1) << 0xf | (uint)(uVar5 == 0) << 6 | (uint)(0x7fff < uVar5) << 7;
  return uVar4 & 0xffff000000000000 | uVar3 & 0xffff00000000 | (ulong)(uVar1 & 0xffff0000) | uVar5;
}

Assistant:

uint64_t HELPER(iwmmxt_srlw)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = (((x & (0xffffll << 0)) >> n) & (0xffffll << 0)) |
        (((x & (0xffffll << 16)) >> n) & (0xffffll << 16)) |
        (((x & (0xffffll << 32)) >> n) & (0xffffll << 32)) |
        (((x & (0xffffll << 48)) >> n) & (0xffffll << 48));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}